

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_location_path(xpath_parser *this)

{
  lexeme_t lVar1;
  xpath_ast_node *pxVar2;
  xpath_ast_node *n_1;
  lexeme_t l;
  xpath_ast_node *n;
  xpath_parser *this_local;
  
  lVar1 = xpath_lexer::current(&this->_lexer);
  if (lVar1 == lex_slash) {
    xpath_lexer::next(&this->_lexer);
    this_local = (xpath_parser *)
                 alloc_node(this,ast_step_root,xpath_type_node_set,(xpath_ast_node *)0x0,
                            (xpath_ast_node *)0x0);
    if (this_local == (xpath_parser *)0x0) {
      this_local = (xpath_parser *)0x0;
    }
    else {
      lVar1 = xpath_lexer::current(&this->_lexer);
      if ((((lVar1 == lex_string) || (lVar1 == lex_axis_attribute)) || (lVar1 == lex_dot)) ||
         ((lVar1 == lex_double_dot || (lVar1 == lex_multiply)))) {
        this_local = (xpath_parser *)parse_relative_location_path(this,(xpath_ast_node *)this_local)
        ;
      }
    }
  }
  else {
    lVar1 = xpath_lexer::current(&this->_lexer);
    if (lVar1 == lex_double_slash) {
      xpath_lexer::next(&this->_lexer);
      pxVar2 = alloc_node(this,ast_step_root,xpath_type_node_set,(xpath_ast_node *)0x0,
                          (xpath_ast_node *)0x0);
      if (pxVar2 == (xpath_ast_node *)0x0) {
        this_local = (xpath_parser *)0x0;
      }
      else {
        pxVar2 = alloc_node(this,ast_step,pxVar2,axis_descendant_or_self,nodetest_type_node,
                            (char_t *)0x0);
        if (pxVar2 == (xpath_ast_node *)0x0) {
          this_local = (xpath_parser *)0x0;
        }
        else {
          this_local = (xpath_parser *)parse_relative_location_path(this,pxVar2);
        }
      }
    }
    else {
      this_local = (xpath_parser *)parse_relative_location_path(this,(xpath_ast_node *)0x0);
    }
  }
  return (xpath_ast_node *)this_local;
}

Assistant:

xpath_ast_node* parse_location_path()
		{
			if (_lexer.current() == lex_slash)
			{
				_lexer.next();

				xpath_ast_node* n = alloc_node(ast_step_root, xpath_type_node_set);
				if (!n) return NULL;

				// relative location path can start from axis_attribute, dot, double_dot, multiply and string lexemes; any other lexeme means standalone root path
				lexeme_t l = _lexer.current();

				if (l == lex_string || l == lex_axis_attribute || l == lex_dot || l == lex_double_dot || l == lex_multiply)
					return parse_relative_location_path(n);
				else
					return n;
			}
			else if (_lexer.current() == lex_double_slash)
			{
				_lexer.next();

				xpath_ast_node* n = alloc_node(ast_step_root, xpath_type_node_set);
				if (!n) return NULL;

				n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, NULL);
				if (!n) return NULL;

				return parse_relative_location_path(n);
			}

			// else clause moved outside of if because of bogus warning 'control may reach end of non-void function being inlined' in gcc 4.0.1
			return parse_relative_location_path(NULL);
		}